

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> * __thiscall
args::EitherFlag::GetShort
          (unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>
           *__return_storage_ptr__,EitherFlag *this,initializer_list<args::EitherFlag> flags)

{
  __hashtable *__h;
  long lVar1;
  char *pcVar2;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *local_28;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  if (flags._M_array != (iterator)0x0) {
    pcVar2 = &this->shortFlag;
    lVar1 = (long)flags._M_array * 0x28;
    do {
      if (((EitherFlag *)(pcVar2 + -1))->isShort == true) {
        local_28 = __return_storage_ptr__;
        std::
        _Hashtable<char,char,std::allocator<char>,std::__detail::_Identity,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<char_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<char,false>>>>
                  ((_Hashtable<char,char,std::allocator<char>,std::__detail::_Identity,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)__return_storage_ptr__,pcVar2,&local_28);
      }
      pcVar2 = pcVar2 + 0x28;
      lVar1 = lVar1 + -0x28;
    } while (lVar1 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::unordered_set<char> GetShort(std::initializer_list<EitherFlag> flags)
        {
            std::unordered_set<char>  shortFlags;
            for (const EitherFlag &flag: flags)
            {
                if (flag.isShort)
                {
                    shortFlags.insert(flag.shortFlag);
                }
            }
            return shortFlags;
        }